

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

void loguru::add_callback
               (char *id,log_handler_t callback,void *user_data,Verbosity verbosity,
               close_handler_t on_close,flush_handler_t on_flush)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  allocator<char> local_81;
  Callback local_80;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)s_mutex);
  if (iVar1 != 0) {
    uVar3 = std::__throw_system_error(iVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.id._M_dataplus._M_p != &local_80.id.field_2) {
      operator_delete(local_80.id._M_dataplus._M_p,local_80.id.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
    _Unwind_Resume(uVar3);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,id,&local_81);
  local_80.indentation = 0;
  local_80.callback = callback;
  local_80.user_data = user_data;
  local_80.verbosity = verbosity;
  local_80.close = on_close;
  local_80.flush = on_flush;
  std::vector<loguru::Callback,_std::allocator<loguru::Callback>_>::emplace_back<loguru::Callback>
            ((vector<loguru::Callback,_std::allocator<loguru::Callback>_> *)&s_callbacks,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.id._M_dataplus._M_p != &local_80.id.field_2) {
    operator_delete(local_80.id._M_dataplus._M_p,local_80.id.field_2._M_allocated_capacity + 1);
  }
  s_max_out_verbosity = -9;
  if (s_callbacks != DAT_006891f0) {
    s_max_out_verbosity = -9;
    lVar2 = s_callbacks;
    do {
      iVar1 = *(int *)(lVar2 + 0x30);
      if (*(int *)(lVar2 + 0x30) < s_max_out_verbosity) {
        iVar1 = s_max_out_verbosity;
      }
      s_max_out_verbosity = iVar1;
      lVar2 = lVar2 + 0x50;
    } while (lVar2 != DAT_006891f0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  return;
}

Assistant:

void add_callback(
		const char*     id,
		log_handler_t   callback,
		void*           user_data,
		Verbosity       verbosity,
		close_handler_t on_close,
		flush_handler_t on_flush)
	{
		std::lock_guard<std::recursive_mutex> lock(s_mutex);
		s_callbacks.push_back(Callback{id, callback, user_data, verbosity, on_close, on_flush, 0});
		on_callback_change();
	}